

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O0

value constructor_metadata(constructor ctor)

{
  value pvVar1;
  value pvVar2;
  value *ppvVar3;
  value *sig_map;
  value sig;
  value args;
  value vi;
  value in_stack_00000040;
  size_t in_stack_ffffffffffffffc8;
  value *in_stack_ffffffffffffffd0;
  constructor in_stack_ffffffffffffffd8;
  value local_8;
  
  pvVar1 = constructor_metadata_visibility((constructor)0x108743);
  if (pvVar1 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    pvVar2 = constructor_metadata_args(in_stack_ffffffffffffffd8);
    if (pvVar2 == (value)0x0) {
      value_type_destroy(in_stack_00000040);
      local_8 = (value)0x0;
    }
    else {
      local_8 = value_create_map(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (local_8 == (value)0x0) {
        value_type_destroy(in_stack_00000040);
        value_type_destroy(in_stack_00000040);
        local_8 = (value)0x0;
      }
      else {
        ppvVar3 = value_to_map((value)0x1087ce);
        *ppvVar3 = pvVar1;
        ppvVar3[1] = pvVar2;
      }
    }
  }
  return local_8;
}

Assistant:

value constructor_metadata(constructor ctor)
{
	value vi, args, sig;
	value *sig_map;

	/* Create return array */
	vi = constructor_metadata_visibility(ctor);

	if (vi == NULL)
	{
		return NULL;
	}

	/* Create arguments map */
	args = constructor_metadata_args(ctor);

	if (args == NULL)
	{
		value_type_destroy(vi);

		return NULL;
	}

	/* Create signature map (return visibility + args) */
	sig = value_create_map(NULL, 2);

	if (sig == NULL)
	{
		value_type_destroy(vi);
		value_type_destroy(args);

		return NULL;
	}

	sig_map = value_to_map(sig);

	sig_map[0] = vi;
	sig_map[1] = args;

	return sig;
}